

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlChar * xmlXPathPopString(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  xmlXPathObjectPtr *ppxVar2;
  uint uVar3;
  xmlChar *pxVar4;
  xmlXPathObjectPtr pxVar5;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    xmlXPathErr((xmlXPathParserContextPtr)0x0,10);
  }
  else {
    iVar1 = ctxt->valueNr;
    if (0 < (long)iVar1) {
      uVar3 = iVar1 - 1;
      ctxt->valueNr = uVar3;
      ppxVar2 = ctxt->valueTab;
      if (iVar1 == 1) {
        pxVar5 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar5 = ppxVar2[(long)iVar1 + -2];
      }
      ctxt->value = pxVar5;
      pxVar5 = ppxVar2[uVar3];
      ppxVar2[uVar3] = (xmlXPathObjectPtr)0x0;
      if (pxVar5 != (xmlXPathObjectPtr)0x0) {
        pxVar4 = xmlXPathCastToString(pxVar5);
        if (pxVar4 == (xmlChar *)0x0) {
          xmlXPathPErrMemory(ctxt);
        }
        xmlXPathReleaseObject(ctxt->context,pxVar5);
        return pxVar4;
      }
    }
    xmlXPathErr(ctxt,10);
    ctxt->error = 10;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlXPathPopString (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    xmlChar * ret;

    obj = valuePop(ctxt);
    if (obj == NULL) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(NULL);
    }
    ret = xmlXPathCastToString(obj);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}